

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O3

bool basisu::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  byte bVar1;
  undefined4 *puVar2;
  char cVar3;
  uint32_t bits;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  undefined1 *puVar9;
  int iVar10;
  uint32_t i;
  uint uVar11;
  ulong uVar12;
  char *__assertion;
  uint32_t bits_1;
  int iVar13;
  uint32_t total_bits;
  uint uVar14;
  uint uVar15;
  uint32_t total_bits_1;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint32_t c;
  long lVar20;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar21;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar22;
  bool bVar23;
  color_rgba endpoints [6];
  uint32_t pbits [6];
  color_rgba block_colors [3] [8];
  uint32_t weights [16];
  undefined1 local_118 [32];
  uint auStack_f8 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_d8 [24];
  uint auStack_78 [18];
  
  uVar16 = mode + 1;
  if (0x20 < uVar16) {
    __assert_fail("codesize <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x71,"uint32_t basisu::read_bits32(const uint8_t *, uint32_t &, uint32_t)");
  }
  uVar14 = 0;
  if (uVar16 == 0) {
    uVar18 = 0;
  }
  else {
    uVar17 = (uint)(mode == 0);
    uVar4 = uVar17 + 2;
    uVar11 = mode == 0 ^ 5;
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar8 = (uint)uVar6 & 7;
      iVar13 = 8 - uVar8;
      if ((int)(uVar16 - uVar5) < iVar13) {
        iVar13 = uVar16 - uVar5;
      }
      uVar14 = uVar14 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (uVar6 >> 3)) >> (sbyte)uVar8)) <<
                        ((byte)uVar5 & 0x1f);
      uVar5 = uVar5 + iVar13;
      uVar6 = (ulong)(iVar13 + (uint)uVar6);
    } while (uVar5 < uVar16);
    uVar18 = 0;
    if (uVar14 == 1 << ((byte)mode & 0x1f)) {
      uVar16 = (uint)(mode != 0) * 2 + 4;
      uVar14 = 0;
      do {
        uVar5 = (uint)uVar6 & 7;
        iVar10 = uVar16 - uVar14;
        iVar13 = 8 - uVar5;
        if (iVar10 < iVar13) {
          iVar13 = iVar10;
        }
        uVar5 = (uint)uVar18 |
                (~(-1 << ((byte)iVar13 & 0x1f)) &
                (uint)(*(byte *)((long)pBlock_bits + (uVar6 >> 3)) >> (sbyte)uVar5)) <<
                ((byte)uVar14 & 0x1f);
        uVar18 = (ulong)uVar5;
        uVar14 = uVar14 + iVar13;
        uVar6 = (ulong)(iVar13 + (uint)uVar6);
      } while (uVar14 < uVar16);
      lVar20 = 0;
      do {
        lVar19 = 0;
        do {
          uVar16 = 0;
          uVar14 = 0;
          do {
            uVar15 = (uint)uVar6;
            uVar8 = uVar15 & 7;
            iVar10 = uVar11 - uVar14;
            iVar13 = 8 - uVar8;
            if (iVar10 < (int)(8 - uVar8)) {
              iVar13 = iVar10;
            }
            uVar16 = uVar16 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                              (uint)(*(byte *)((long)pBlock_bits + (uVar6 >> 3)) >> (sbyte)uVar8))
                              << ((byte)uVar14 & 0x1f);
            uVar14 = uVar14 + iVar13;
            uVar6 = (ulong)(iVar13 + uVar15);
          } while (uVar14 < uVar11);
          *(char *)((long)auStack_f8 + lVar19 * 4 + lVar20 + -0x20) = (char)uVar16;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 6);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      if (mode == 0) {
        iVar13 = 8 - uVar8;
        if (iVar10 < (int)(8 - uVar8)) {
          iVar13 = iVar10;
        }
        uVar6 = 0;
        do {
          uVar16 = (int)uVar6 + iVar13 + uVar15;
          auStack_f8[uVar6] =
               (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar16 >> 3)) >> (uVar16 & 7) & 1) != 0
                     );
          uVar12 = uVar6 + 1;
          bVar23 = uVar6 < 5;
          uVar6 = uVar12;
        } while (bVar23);
        iVar13 = 8 - uVar8;
        if (iVar10 < (int)(8 - uVar8)) {
          iVar13 = iVar10;
        }
        uVar6 = (ulong)(uVar15 + (int)uVar12 + iVar13);
      }
      uVar17 = uVar17 + 1;
      uVar12 = 0;
      do {
        uVar16 = uVar17;
        if (((uVar12 != 0) &&
            (uVar12 != (byte)basist::g_bc7_table_anchor_index_third_subset_1[uVar18])) &&
           (uVar16 = uVar4, uVar12 == (byte)basist::g_bc7_table_anchor_index_third_subset_2[uVar18])
           ) {
          uVar16 = uVar17;
        }
        uVar14 = 0;
        uVar11 = 0;
        do {
          uVar8 = (uint)uVar6 & 7;
          iVar13 = 8 - uVar8;
          if ((int)(uVar16 - uVar11) < iVar13) {
            iVar13 = uVar16 - uVar11;
          }
          uVar14 = uVar14 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                            (uint)(*(byte *)((long)pBlock_bits + (uVar6 >> 3)) >> (sbyte)uVar8)) <<
                            ((byte)uVar11 & 0x1f);
          uVar11 = uVar11 + iVar13;
          uVar8 = iVar13 + (uint)uVar6;
          uVar6 = (ulong)uVar8;
        } while (uVar11 < uVar16);
        auStack_78[uVar12] = uVar14;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x10);
      if (uVar8 != 0x80) {
        __assert_fail("bit_offset == 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                      ,0x1e2,"bool basisu::unpack_bc7_mode0_2(uint32_t, const void *, color_rgba *)"
                     );
      }
      puVar9 = local_118;
      lVar20 = 0;
      do {
        lVar19 = 0;
        do {
          bVar1 = puVar9[lVar19];
          if (mode == 0) {
            if (0xf < bVar1) {
              __assertion = "val < (1U << val_bits)";
LAB_00244ebe:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b0,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t, uint32_t)");
            }
            if (1 < auStack_f8[lVar20]) {
              __assertion = "pbit < 2";
              goto LAB_00244ebe;
            }
            cVar3 = (char)((uint)bVar1 * 2 >> 2) +
                    ((char)auStack_f8[lVar20] + bVar1 * '\x02') * '\b';
          }
          else {
            if (0x1f < bVar1) {
              __assert_fail("val < (1U << val_bits)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b1,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t)");
            }
            cVar3 = (char)((uint)bVar1 * 8 >> 5) + bVar1 * '\b';
          }
          puVar9[lVar19] = cVar3;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        puVar9[3] = 0xff;
        lVar20 = lVar20 + 1;
        puVar9 = puVar9 + 4;
      } while (lVar20 != 6);
      paVar22 = local_d8;
      puVar9 = local_118 + 4;
      lVar20 = 0;
      do {
        uVar18 = 0;
        paVar21 = paVar22;
        do {
          lVar19 = 0;
          do {
            if (mode == 0) {
              puVar2 = &basist::g_bc7_weights3;
              if (7 < uVar18) {
                __assert_fail("w < 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                              ,0x1b4,"uint32_t basisu::bc7_interp3(uint32_t, uint32_t, uint32_t)");
              }
            }
            else {
              puVar2 = &basist::g_bc7_weights2;
              if (3 < uVar18) {
                __assert_fail("w < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                              ,0x1b3,"uint32_t basisu::bc7_interp2(uint32_t, uint32_t, uint32_t)");
              }
            }
            paVar21->m_comps[lVar19] =
                 (uint8_t)((0x40 - puVar2[uVar18]) * (uint)(byte)puVar9[lVar19 + -4] +
                           (uint)(byte)puVar9[lVar19] * puVar2[uVar18] + 0x20 >> 6);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          local_d8[0].m_comps[uVar18 * 4 + lVar20 * 0x20 + 3] = 0xff;
          uVar18 = uVar18 + 1;
          sVar7 = (sbyte)uVar4;
          paVar21 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar21->m_comps + 4);
        } while ((uint)uVar18 >> sVar7 == 0);
        lVar20 = lVar20 + 1;
        puVar9 = puVar9 + 8;
        paVar22 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar22->m_comps + 0x20);
      } while (lVar20 != 3);
      uVar18 = (ulong)(0 >> sVar7);
      do {
        pPixels[uVar18].field_0 =
             local_d8[(ulong)(byte)basist::g_bc7_partition3[uVar18 + (uVar5 << 4)] * 8 +
                      (ulong)auStack_78[uVar18]];
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x10);
      uVar18 = 1;
    }
  }
  return SUB81(uVar18,0);
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 3;
		const uint32_t ENDPOINTS = 6;
		const uint32_t COMPS = 3;
		const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
		const uint32_t PBITS = (mode == 0) ? 6 : 0;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

		uint32_t pbits[6];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);

		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_third_subset_1[part]) || (i == basist::g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

		color_rgba block_colors[3][8];
		for (uint32_t s = 0; s < 3; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < 3; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = 255;
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition3[part * 16 + i]][weights[i]];

		return true;
	}